

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

ArrayElement * __thiscall
soul::PoolAllocator::
allocate<soul::heart::ArrayElement,soul::CodeLocation_const&,soul::heart::Expression&,unsigned_long_const&,unsigned_long_const&>
          (PoolAllocator *this,CodeLocation *args,Expression *args_1,unsigned_long *args_2,
          unsigned_long *args_3)

{
  PoolItem *pPVar1;
  CodeLocation local_40;
  
  pPVar1 = allocateSpaceForObject(this,0x58);
  local_40.sourceCode.object = (args->sourceCode).object;
  if (local_40.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_40.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_40.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_40.location.data = (args->location).data;
  heart::ArrayElement::ArrayElement((ArrayElement *)&pPVar1->item,&local_40,args_1,*args_2,*args_3);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_40.sourceCode);
  pPVar1->destructor =
       allocate<soul::heart::ArrayElement,_const_soul::CodeLocation_&,_soul::heart::Expression_&,_const_unsigned_long_&,_const_unsigned_long_&>
       ::anon_class_1_0_00000001::__invoke;
  return (ArrayElement *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }